

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O3

void __thiscall ProfileHandler::Reset(ProfileHandler *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  undefined1 local_c8 [8];
  ScopedSignalBlocker block;
  CallbackList copy;
  SpinLockHolder sl;
  SpinLockHolder cl;
  
  sl.lock_ = &this->control_lock_;
  LOCK();
  bVar4 = (this->control_lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar4) {
    (this->control_lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar4) {
    SpinLock::SlowLock(sl.lock_);
  }
  p_Var1 = (_List_node_base *)(block.sig_set_.__val + 0xf);
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  block.sig_set_.__val[0xf] = (unsigned_long)p_Var1;
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = p_Var1;
  ScopedSignalBlocker::ScopedSignalBlocker((ScopedSignalBlocker *)local_c8,this->signal_number_);
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node._M_size = (size_t)&this->signal_lock_;
  LOCK();
  bVar4 = (this->signal_lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar4) {
    (this->signal_lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar4) {
    SpinLock::SlowLock((SpinLock *)
                       copy.
                       super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>
                       ._M_impl._M_node._M_size);
  }
  std::__detail::_List_node_base::swap(p_Var1,(_List_node_base *)&this->callbacks_);
  p_Var3 = (_List_node_base *)
           (this->callbacks_).
           super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
           _M_node._M_size;
  (this->callbacks_).super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>
  ._M_impl._M_node._M_size =
       (size_t)copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
               _M_impl._M_node.super__List_node_base._M_prev;
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = p_Var3;
  SpinLockHolder::~SpinLockHolder
            ((SpinLockHolder *)
             &copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
              _M_impl._M_node._M_size);
  ScopedSignalBlocker::~ScopedSignalBlocker((ScopedSignalBlocker *)local_c8);
  for (p_Var3 = (_List_node_base *)block.sig_set_.__val[0xf]; p_Var3 != p_Var1;
      p_Var3 = p_Var3->_M_next) {
    operator_delete(p_Var3[1]._M_next,0x10);
  }
  this->callback_count_ = 0;
  UpdateTimer(this,false);
  p_Var3 = (_List_node_base *)block.sig_set_.__val[0xf];
  while (p_Var3 != p_Var1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  SpinLockHolder::~SpinLockHolder(&sl);
  return;
}

Assistant:

void ProfileHandler::Reset() {
  SpinLockHolder cl(&control_lock_);
  CallbackList copy;
  {
    ScopedSignalBlocker block(signal_number_);
    SpinLockHolder sl(&signal_lock_);
    // Only do swap under this critical lock.
    using std::swap;
    swap(copy, callbacks_);
  }
  for (ProfileHandlerToken* token : copy) {
    delete token;
  }
  callback_count_ = 0;
  UpdateTimer(false);
  // copy gets deleted here
}